

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  int iVar1;
  uint uVar2;
  long lVar3;
  pointer piVar4;
  uint uVar5;
  pointer piVar6;
  LogMessage *pLVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  SourceLocation *pSVar11;
  long lVar12;
  bool bVar13;
  LogFinisher local_1d1;
  long local_1d0;
  SourceLocation *local_1c8;
  long local_1c0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_1c8 = out_location;
  internal::CheckNotNull<google::protobuf::SourceLocation>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
             ,1999,"\'out_location\' must not be NULL",out_location);
  lVar12 = *(long *)(this + 0x98);
  if (lVar12 != 0) {
    lVar10 = 0;
    local_1c0 = lVar12;
    do {
      if (*(int *)(lVar12 + 0x18) <= lVar10) {
        return false;
      }
      lVar3 = *(long *)(*(long *)(lVar12 + 0x10) + lVar10 * 8);
      piVar6 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      piVar4 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
      if ((long)piVar4 - (long)piVar6 >> 2 == (long)*(int *)(lVar3 + 0x18)) {
        bVar13 = piVar4 == piVar6;
        local_1d0 = lVar10;
        if (!bVar13) {
          uVar9 = 0;
          do {
            iVar1 = piVar6[uVar9];
            if ((long)*(int *)(lVar3 + 0x18) <= (long)uVar9) {
              internal::LogMessage::LogMessage
                        (&local_180,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x265);
              pLVar7 = internal::LogMessage::operator<<
                                 (&local_180,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar7);
              internal::LogMessage::~LogMessage(&local_180);
            }
            if (iVar1 != *(int *)(*(long *)(lVar3 + 0x10) + uVar9 * 4)) break;
            uVar9 = uVar9 + 1;
            piVar6 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = (long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
            bVar13 = uVar8 <= uVar9;
          } while (uVar9 < uVar8);
        }
        lVar12 = local_1c0;
        lVar10 = local_1d0;
        if (bVar13) {
          if (*(int *)(local_1c0 + 0x18) <= local_1d0) {
            internal::LogMessage::LogMessage
                      (&local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                       ,0x338);
            pLVar7 = internal::LogMessage::operator<<
                               (&local_148,"CHECK failed: (index) < (size()): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar7);
            internal::LogMessage::~LogMessage(&local_148);
          }
          lVar3 = *(long *)(*(long *)(lVar12 + 0x10) + lVar10 * 8);
          if (*(int *)(lVar3 + 0x30) - 3U < 2) {
            pSVar11 = local_1c8;
            if (*(int *)(lVar3 + 0x30) < 1) {
              internal::LogMessage::LogMessage
                        (&local_110,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x265);
              pLVar7 = internal::LogMessage::operator<<
                                 (&local_110,"CHECK failed: (index) < (size()): ");
              pSVar11 = local_1c8;
              internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar7);
              internal::LogMessage::~LogMessage(&local_110);
            }
            pSVar11->start_line = **(int **)(lVar3 + 0x28);
            if (*(int *)(lVar3 + 0x30) < 2) {
              internal::LogMessage::LogMessage
                        (&local_d8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x265);
              pLVar7 = internal::LogMessage::operator<<
                                 (&local_d8,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar7);
              internal::LogMessage::~LogMessage(&local_d8);
            }
            pSVar11->start_column = *(int *)(*(long *)(lVar3 + 0x28) + 4);
            uVar2 = *(uint *)(lVar3 + 0x30);
            uVar5 = (uint)(uVar2 != 3) * 2;
            if (uVar2 == uVar5 ||
                SBORROW4(uVar2,uVar5) != (int)(uVar2 + (uint)(uVar2 != 3) * -2) < 0) {
              internal::LogMessage::LogMessage
                        (&local_a0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x265);
              pLVar7 = internal::LogMessage::operator<<
                                 (&local_a0,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar7);
              internal::LogMessage::~LogMessage(&local_a0);
            }
            pSVar11 = local_1c8;
            local_1c8->end_line = *(int *)(*(long *)(lVar3 + 0x28) + (ulong)uVar5 * 4);
            local_1c8->end_column =
                 *(int *)(*(long *)(lVar3 + 0x28) + -4 + (long)*(int *)(lVar3 + 0x30) * 4);
            if (*(int *)(lVar12 + 0x18) <= (int)local_1d0) {
              internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar7 = internal::LogMessage::operator<<
                                 (&local_68,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar7);
              internal::LogMessage::~LogMessage(&local_68);
            }
            lVar10 = local_1d0;
            std::__cxx11::string::_M_assign((string *)&pSVar11->leading_comments);
            if (*(int *)(lVar12 + 0x18) <= (int)lVar10) {
              internal::LogMessage::LogMessage
                        (&local_1b8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar7 = internal::LogMessage::operator<<
                                 (&local_1b8,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=(&local_1d1,pLVar7);
              internal::LogMessage::~LogMessage(&local_1b8);
            }
            std::__cxx11::string::_M_assign((string *)&pSVar11->trailing_comments);
            return true;
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar12 != 0);
  }
  return false;
}

Assistant:

bool FileDescriptor::GetSourceLocation(const vector<int>& path,
                                       SourceLocation* out_location) const {
  GOOGLE_CHECK_NOTNULL(out_location);
  const SourceCodeInfo* info = source_code_info_;
  for (int i = 0; info && i < info->location_size(); ++i) {
    if (PathsEqual(path, info->location(i).path())) {
      const RepeatedField<int32>& span = info->location(i).span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line   = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line     = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column   = span.Get(span.size() - 1);

        out_location->leading_comments = info->location(i).leading_comments();
        out_location->trailing_comments = info->location(i).trailing_comments();
        return true;
      }
    }
  }
  return false;
}